

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar3 = ctxt->valueNr;
    if ((long)iVar3 < 1) {
      iVar3 = 0x17;
    }
    else {
      uVar2 = iVar3 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar3 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ppxVar1[(long)iVar3 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar4 != (xmlXPathObjectPtr)0x0) {
        if (pxVar4->type != XPATH_BOOLEAN) {
          iVar3 = xmlXPathCastToBoolean(pxVar4);
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          pxVar4 = xmlXPathCacheNewBoolean(ctxt,iVar3);
        }
        xmlXPathValuePush(ctxt,pxVar4);
        return;
      }
      iVar3 = 10;
    }
  }
  else {
    iVar3 = 0xc;
  }
  xmlXPathErr(ctxt,iVar3);
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = xmlXPathValuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_BOOLEAN) {
        int boolval = xmlXPathCastToBoolean(cur);

        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheNewBoolean(ctxt, boolval);
    }
    xmlXPathValuePush(ctxt, cur);
}